

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O2

void Gia_ManAddNextEntry_rec(Gia_Man_t *p,Gia_Obj_t *pOld,Gia_Obj_t *pNode)

{
  int iVar1;
  int Id;
  
  while( true ) {
    iVar1 = Gia_ObjId(p,pOld);
    iVar1 = p->pNexts[iVar1];
    Id = Gia_ObjId(p,pOld);
    if (iVar1 == 0) break;
    pOld = Gia_ObjNextObj(p,Id);
  }
  iVar1 = Gia_ObjId(p,pNode);
  p->pNexts[Id] = iVar1;
  return;
}

Assistant:

void Gia_ManAddNextEntry_rec( Gia_Man_t * p, Gia_Obj_t * pOld, Gia_Obj_t * pNode )
{
    if ( Gia_ObjNext(p, Gia_ObjId(p, pOld)) == 0 )
    {
        Gia_ObjSetNext( p, Gia_ObjId(p, pOld), Gia_ObjId(p, pNode) );
        return;
    }
    Gia_ManAddNextEntry_rec( p, Gia_ObjNextObj(p, Gia_ObjId(p, pOld)), pNode );
}